

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_line_buffer.cpp
# Opt level: O0

void __thiscall
NshLineBufferAppendChar_SuccessOneChar_Test::~NshLineBufferAppendChar_SuccessOneChar_Test
          (NshLineBufferAppendChar_SuccessOneChar_Test *this)

{
  NshLineBufferAppendChar_SuccessOneChar_Test *this_local;
  
  ~NshLineBufferAppendChar_SuccessOneChar_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshLineBufferAppendChar, SuccessOneChar)
{
    nsh_line_buffer_t line;
    nsh_line_buffer_reset(&line);

    auto status = nsh_line_buffer_append_char(&line, 'a');

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_EQ(line.size, 1);
    ASSERT_EQ(line.buffer[0], 'a');
}